

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_shape(REF_CELL_TYPE cell_type,REF_DBL *bary,REF_DBL *shape)

{
  REF_STATUS RVar1;
  REF_STATUS RVar2;
  size_t __n;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  RVar1 = 0;
  RVar2 = 0;
  switch(cell_type) {
  case REF_CELL_EDG:
    RVar2 = 0;
    lVar3 = 0;
    do {
      shape[lVar3] = bary[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    break;
  case REF_CELL_ED2:
    dVar4 = *bary * 4.0 * bary[1];
    shape[2] = dVar4;
    dVar4 = dVar4 * -0.5;
    *shape = *bary + dVar4;
    shape[1] = dVar4 + bary[1];
    RVar2 = RVar1;
    break;
  case REF_CELL_ED3:
    dVar4 = *bary;
    *shape = (dVar4 + -0.6666666666666666) * (dVar4 + -0.3333333333333333) * dVar4 * 4.5;
    dVar4 = bary[1];
    shape[1] = (dVar4 + -0.6666666666666666) * (dVar4 + -0.3333333333333333) * dVar4 * 4.5;
    shape[2] = (*bary + -0.3333333333333333) * *bary * 13.5 * bary[1];
    shape[3] = (bary[1] + -0.3333333333333333) * bary[1] * 13.5 * *bary;
    RVar2 = RVar1;
    break;
  case REF_CELL_TRI:
    RVar2 = 0;
    lVar3 = 0;
    do {
      shape[lVar3] = bary[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    break;
  case REF_CELL_TR2:
    dVar5 = *bary * 4.0 * bary[1];
    shape[3] = dVar5;
    dVar6 = bary[1] * 4.0 * bary[2];
    shape[4] = dVar6;
    dVar4 = bary[2] * 4.0 * *bary;
    shape[5] = dVar4;
    dVar5 = dVar5 * -0.5;
    dVar4 = dVar4 * -0.5;
    *shape = *bary + dVar5 + dVar4;
    dVar6 = dVar6 * -0.5;
    shape[1] = dVar5 + bary[1] + dVar6;
    shape[2] = dVar6 + bary[2] + dVar4;
    RVar2 = RVar1;
    break;
  case REF_CELL_TR3:
    dVar4 = *bary;
    *shape = (dVar4 + -0.6666666666666666) * (dVar4 + -0.3333333333333333) * dVar4 * 4.5;
    dVar4 = bary[1];
    shape[1] = (dVar4 + -0.6666666666666666) * (dVar4 + -0.3333333333333333) * dVar4 * 4.5;
    dVar4 = bary[2];
    shape[2] = (dVar4 + -0.6666666666666666) * (dVar4 + -0.3333333333333333) * dVar4 * 4.5;
    shape[3] = (*bary + -0.3333333333333333) * *bary * 13.5 * bary[1];
    shape[4] = (bary[1] + -0.3333333333333333) * *bary * 13.5 * bary[1];
    shape[5] = (bary[1] + -0.3333333333333333) * bary[1] * 13.5 * bary[2];
    shape[6] = (bary[2] + -0.3333333333333333) * bary[1] * 13.5 * bary[2];
    shape[7] = (bary[2] + -0.3333333333333333) * bary[2] * 13.5 * *bary;
    shape[8] = (*bary + -0.3333333333333333) * bary[2] * 13.5 * *bary;
    shape[9] = *bary * 27.0 * bary[1] * bary[2];
    RVar2 = 0;
    break;
  case REF_CELL_QUA:
    goto LAB_0011535f;
  case REF_CELL_QU2:
    shape[6] = 0.0;
    shape[7] = 0.0;
    shape[4] = 0.0;
    shape[5] = 0.0;
    shape[2] = 0.0;
    shape[3] = 0.0;
    *shape = 0.0;
    shape[1] = 0.0;
    shape[8] = 0.0;
    goto LAB_00115368;
  case REF_CELL_TET:
    RVar2 = 0;
    lVar3 = 0;
    do {
      shape[lVar3] = bary[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case REF_CELL_PYR:
    shape[2] = 0.0;
    shape[3] = 0.0;
    *shape = 0.0;
    shape[1] = 0.0;
    shape[4] = 0.0;
    goto LAB_00115368;
  case REF_CELL_PRI:
    goto LAB_0011535a;
  case REF_CELL_HEX:
    goto LAB_00115349;
  case REF_CELL_TE2:
    goto LAB_00115344;
  case REF_CELL_PY2:
    shape[0xc] = 0.0;
    shape[0xd] = 0.0;
    shape[10] = 0.0;
    shape[0xb] = 0.0;
LAB_00115344:
    shape[8] = 0.0;
    shape[9] = 0.0;
LAB_00115349:
    shape[6] = 0.0;
    shape[7] = 0.0;
LAB_0011535a:
    shape[4] = 0.0;
    shape[5] = 0.0;
LAB_0011535f:
    shape[2] = 0.0;
    shape[3] = 0.0;
    *shape = 0.0;
    shape[1] = 0.0;
    goto LAB_00115368;
  case REF_CELL_PR2:
    __n = 0x90;
    goto LAB_00115153;
  case REF_CELL_HE2:
    __n = 0xd8;
LAB_00115153:
    memset(shape,0,__n);
LAB_00115368:
    RVar2 = 6;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_shape(REF_CELL_TYPE cell_type, REF_DBL *bary,
                                  REF_DBL *shape) {
  REF_INT cell_node;
  switch (cell_type) {
    case REF_CELL_EDG:
      for (cell_node = 0; cell_node < 2; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_TRI:
      for (cell_node = 0; cell_node < 3; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_TET:
      for (cell_node = 0; cell_node < 4; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_ED2:
      shape[2] = 4.0 * bary[0] * bary[1];
      shape[0] = bary[0] - 0.5 * shape[2];
      shape[1] = bary[1] - 0.5 * shape[2];
      break;
    case REF_CELL_ED3:
      shape[0] =
          9.0 / 2.0 * bary[0] * (bary[0] - 1.0 / 3.0) * (bary[0] - 2.0 / 3.0);
      shape[1] =
          9.0 / 2.0 * bary[1] * (bary[1] - 1.0 / 3.0) * (bary[1] - 2.0 / 3.0);
      shape[2] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[0] - 1.0 / 3.0);
      shape[3] = 27.0 / 2.0 * bary[1] * bary[0] * (bary[1] - 1.0 / 3.0);
      break;
    case REF_CELL_TR2:
      shape[3] = 4.0 * bary[0] * bary[1];
      shape[4] = 4.0 * bary[1] * bary[2];
      shape[5] = 4.0 * bary[2] * bary[0];
      shape[0] = bary[0] - 0.5 * shape[3] - 0.5 * shape[5];
      shape[1] = bary[1] - 0.5 * shape[3] - 0.5 * shape[4];
      shape[2] = bary[2] - 0.5 * shape[4] - 0.5 * shape[5];
      break;
    case REF_CELL_TR3:
      shape[0] =
          9.0 / 2.0 * bary[0] * (bary[0] - 1.0 / 3.0) * (bary[0] - 2.0 / 3.0);
      shape[1] =
          9.0 / 2.0 * bary[1] * (bary[1] - 1.0 / 3.0) * (bary[1] - 2.0 / 3.0);
      shape[2] =
          9.0 / 2.0 * bary[2] * (bary[2] - 1.0 / 3.0) * (bary[2] - 2.0 / 3.0);

      shape[3] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[0] - 1.0 / 3.0);
      shape[4] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[1] - 1.0 / 3.0);

      shape[5] = 27.0 / 2.0 * bary[1] * bary[2] * (bary[1] - 1.0 / 3.0);
      shape[6] = 27.0 / 2.0 * bary[1] * bary[2] * (bary[2] - 1.0 / 3.0);

      shape[7] = 27.0 / 2.0 * bary[2] * bary[0] * (bary[2] - 1.0 / 3.0);
      shape[8] = 27.0 / 2.0 * bary[2] * bary[0] * (bary[0] - 1.0 / 3.0);

      shape[9] = 27.0 * bary[0] * bary[1] * bary[2];
      break;
    case REF_CELL_QUA:
      for (cell_node = 0; cell_node < 4; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_QU2:
      for (cell_node = 0; cell_node < 9; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PYR:
      for (cell_node = 0; cell_node < 5; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PRI:
      for (cell_node = 0; cell_node < 6; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_HEX:
      for (cell_node = 0; cell_node < 8; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_TE2:
      for (cell_node = 0; cell_node < 10; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PY2:
      for (cell_node = 0; cell_node < 14; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PR2:
      for (cell_node = 0; cell_node < 18; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_HE2:
      for (cell_node = 0; cell_node < 27; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
  }
  return REF_SUCCESS;
}